

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

Connection * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,InterpolationType *args_1,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_2,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_3,
          pool_ptr<soul::AST::Expression> *args_4)

{
  InterpolationType IVar1;
  SharedEndpoint *pSVar2;
  SharedEndpoint *pSVar3;
  Expression *pEVar4;
  SourceCodeText *pSVar5;
  Scope *pSVar6;
  PoolItem *pPVar7;
  
  pPVar7 = allocateSpaceForObject(this,0x48);
  IVar1 = *args_1;
  pSVar2 = args_2->object;
  pSVar3 = args_3->object;
  pEVar4 = args_4->object;
  *(undefined4 *)&pPVar7->field_0x18 = 6;
  pSVar5 = (args->location).sourceCode.object;
  pPVar7[1].size = (size_t)pSVar5;
  if (pSVar5 != (SourceCodeText *)0x0) {
    (pSVar5->super_RefCountedObject).refCount = (pSVar5->super_RefCountedObject).refCount + 1;
  }
  pSVar6 = args->parentScope;
  pPVar7[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar7[1].item = pSVar6;
  pPVar7->item = &PTR__Connection_002cc3a0;
  *(InterpolationType *)&pPVar7[1].field_0x18 = IVar1;
  pPVar7[2].size = (size_t)pSVar2;
  pPVar7[2].destructor = (DestructorFn *)pSVar3;
  pPVar7[2].item = pEVar4;
  pPVar7->destructor =
       allocate<soul::AST::Connection,_soul::AST::Context_&,_soul::InterpolationType_&,_soul::pool_ref<soul::AST::Connection::SharedEndpoint>_&,_soul::pool_ref<soul::AST::Connection::SharedEndpoint>_&,_soul::pool_ptr<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (Connection *)&pPVar7->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }